

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

_Bool art_iterator_up_and_move(art_iterator_t *iterator,_Bool forward)

{
  byte bVar1;
  _Bool _Var2;
  
  if (iterator->frame != '\0') {
    bVar1 = iterator->frame - 1;
    iterator->frame = bVar1;
    iterator->depth = iterator->depth + ~(byte)iterator->frames[bVar1].node[1];
    _Var2 = art_iterator_move(iterator,forward);
    return _Var2;
  }
  iterator->key[4] = '\0';
  iterator->key[5] = '\0';
  iterator->key[0] = '\0';
  iterator->key[1] = '\0';
  iterator->key[2] = '\0';
  iterator->key[3] = '\0';
  iterator->value = (art_val_t *)0x0;
  return false;
}

Assistant:

static bool art_iterator_up(art_iterator_t *iterator) {
    if (iterator->frame == 0) {
        return false;
    }
    iterator->frame--;
    // We went up, so we are at an inner node.
    iterator->depth -=
        ((art_inner_node_t *)art_iterator_node(iterator))->prefix_size + 1;
    return true;
}